

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

wchar_t psftp_connect(char *userhost,char *user,wchar_t portnumber)

{
  char cVar1;
  LogContext *pLVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  char *in_RAX;
  char *pcVar6;
  Conf *pCVar7;
  BackendVtable *pBVar8;
  char *__s;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  char *value;
  char *realhost;
  
  realhost = in_RAX;
  pcVar6 = strrchr(userhost,0x40);
  if (pcVar6 == (char *)0x0) {
    value = (char *)0x0;
  }
  else {
    *pcVar6 = '\0';
    value = userhost;
    userhost = pcVar6 + 1;
  }
  _Var3 = cmdline_loaded_session();
  if (_Var3) {
    conf_set_str(conf,0,userhost);
  }
  else {
    pCVar7 = conf_new();
    conf_set_str(pCVar7,0,anon_var_dwarf_34f89 + 10);
    do_defaults(userhost,pCVar7);
    pcVar6 = conf_get_str(pCVar7,0);
    if (*pcVar6 == '\0') {
      conf_set_str(conf,0,userhost);
    }
    else {
      do_defaults(userhost,conf);
    }
    conf_free(pCVar7);
  }
  iVar4 = conf_get_int(conf,2);
  pBVar8 = backend_vt_from_proto(iVar4);
  if (pBVar8 == (BackendVtable *)0x0) {
    conf_set_int(conf,2,3);
    conf_set_int(conf,1,0x16);
  }
  uVar5 = conf_get_int(conf,0x23);
  if ((uVar5 & 0xfffffffe) != 2) {
    conf_set_int(conf,0x23,2);
  }
  cmdline_run_saved(conf);
  pcVar6 = conf_get_str(conf,0);
  __s = dupstr(pcVar6);
  sVar9 = strspn(__s," \t");
  pcVar6 = __s + sVar9;
  pcVar11 = __s;
  if ((__s[sVar9] != '\0') && (pcVar10 = strrchr(pcVar6,0x40), pcVar10 != (char *)0x0)) {
    *pcVar10 = '\0';
    conf_set_str(conf,0x39,pcVar6);
    pcVar6 = pcVar10 + 1;
  }
  do {
    cVar1 = *pcVar6;
    if ((cVar1 != '\t') && (cVar1 != ' ')) {
      if (cVar1 == '\0') {
        *pcVar11 = '\0';
        conf_set_str(conf,0,__s);
        safefree(__s);
        if ((value != (char *)0x0) && (*value != '\0')) {
          conf_set_str(conf,0x39,value);
        }
        if ((int)user != 0) {
          conf_set_int(conf,1,(int)user);
        }
        conf_set_bool(conf,0xaa,false);
        conf_set_bool(conf,0x1e,false);
        conf_set_bool(conf,0xbf,true);
        while (pcVar6 = conf_get_str_nthstrkey(conf,0xb0,0), pcVar6 != (char *)0x0) {
          conf_del_str_str(conf,0xb0,pcVar6);
        }
        conf_set_str(conf,0x14,"sftp");
        conf_set_bool(conf,0x30,true);
        conf_set_bool(conf,0x16,true);
        conf_set_str(conf,0x15,
                     "test -x /usr/lib/sftp-server && exec /usr/lib/sftp-server\ntest -x /usr/local/lib/sftp-server && exec /usr/local/lib/sftp-server\nexec sftp-server"
                    );
        conf_set_bool(conf,0x31,false);
        psftp_logctx = log_init(console_cli_logpolicy,conf);
        platform_psftp_pre_conn_setup(console_cli_logpolicy);
        iVar4 = conf_get_int(conf,2);
        pBVar8 = backend_vt_from_proto(iVar4);
        pLVar2 = psftp_logctx;
        pCVar7 = conf;
        pcVar6 = conf_get_str(conf,0);
        iVar4 = conf_get_int(conf,1);
        _Var3 = conf_get_bool(conf,8);
        pcVar6 = (*pBVar8->init)(pBVar8,psftp_seat,&backend,pLVar2,pCVar7,pcVar6,iVar4,&realhost,
                                 false,_Var3);
        if (pcVar6 == (char *)0x0) {
          do {
            _Var3 = (*backend->vt->sendok)(backend);
            if (_Var3) {
              if ((realhost != (char *)0x0 & verbose) == 1) {
                printf("Connected to %s\n");
              }
              if (realhost == (char *)0x0) {
                return L'\0';
              }
              safefree(realhost);
              return L'\0';
            }
            iVar4 = (*backend->vt->exitcode)(backend);
            if (-1 < iVar4) {
              return L'\x01';
            }
            iVar4 = ssh_sftp_loop_iteration();
          } while (-1 < iVar4);
          psftp_connect_cold_1();
        }
        else {
          fprintf(_stderr,"ssh_init: %s\n",pcVar6);
        }
        return L'\x01';
      }
      *pcVar11 = cVar1;
      pcVar11 = pcVar11 + 1;
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

static int psftp_connect(char *userhost, char *user, int portnumber)
{
    char *host, *realhost;
    const char *err;

    /* Separate host and username */
    host = userhost;
    host = strrchr(host, '@');
    if (host == NULL) {
        host = userhost;
    } else {
        *host++ = '\0';
        if (user) {
            printf("psftp: multiple usernames specified; using \"%s\"\n",
                   user);
        } else
            user = userhost;
    }

    /*
     * If we haven't loaded session details already (e.g., from -load),
     * try looking for a session called "host".
     */
    if (!cmdline_loaded_session()) {
        /* Try to load settings for `host' into a temporary config */
        Conf *conf2 = conf_new();
        conf_set_str(conf2, CONF_host, "");
        do_defaults(host, conf2);
        if (conf_get_str(conf2, CONF_host)[0] != '\0') {
            /* Settings present and include hostname */
            /* Re-load data into the real config. */
            do_defaults(host, conf);
        } else {
            /* Session doesn't exist or mention a hostname. */
            /* Use `host' as a bare hostname. */
            conf_set_str(conf, CONF_host, host);
        }
        conf_free(conf2);
    } else {
        /* Patch in hostname `host' to session details. */
        conf_set_str(conf, CONF_host, host);
    }

    /*
     * Force protocol to SSH if the user has somehow contrived to
     * select one we don't support (e.g. by loading an inappropriate
     * saved session). In that situation we assume the port number is
     * useless too.)
     */
    if (!backend_vt_from_proto(conf_get_int(conf, CONF_protocol))) {
        conf_set_int(conf, CONF_protocol, PROT_SSH);
        conf_set_int(conf, CONF_port, 22);
    }

    /*
     * If saved session / Default Settings says SSH-1 (`1 only' or `1'),
     * then change it to SSH-2, on the grounds that that's more likely to
     * work for SFTP. (Can be overridden with `-1' option.)
     * But if it says `2 only' or `2', respect which.
     */
    if ((conf_get_int(conf, CONF_sshprot) & ~1) != 2)   /* is it 2 or 3? */
        conf_set_int(conf, CONF_sshprot, 2);

    /*
     * Enact command-line overrides.
     */
    cmdline_run_saved(conf);

    /*
     * Muck about with the hostname in various ways.
     */
    {
        char *hostbuf = dupstr(conf_get_str(conf, CONF_host));
        char *host = hostbuf;
        char *p, *q;

        /*
         * Trim leading whitespace.
         */
        host += strspn(host, " \t");

        /*
         * See if host is of the form user@host, and separate out
         * the username if so.
         */
        if (host[0] != '\0') {
            char *atsign = strrchr(host, '@');
            if (atsign) {
                *atsign = '\0';
                conf_set_str(conf, CONF_username, host);
                host = atsign + 1;
            }
        }

        /*
         * Remove any remaining whitespace.
         */
        p = hostbuf;
        q = host;
        while (*q) {
            if (*q != ' ' && *q != '\t')
                *p++ = *q;
            q++;
        }
        *p = '\0';

        conf_set_str(conf, CONF_host, hostbuf);
        sfree(hostbuf);
    }

    /* Set username */
    if (user != NULL && user[0] != '\0') {
        conf_set_str(conf, CONF_username, user);
    }

    if (portnumber)
        conf_set_int(conf, CONF_port, portnumber);

    /*
     * Disable scary things which shouldn't be enabled for simple
     * things like SCP and SFTP: agent forwarding, port forwarding,
     * X forwarding.
     */
    conf_set_bool(conf, CONF_x11_forward, false);
    conf_set_bool(conf, CONF_agentfwd, false);
    conf_set_bool(conf, CONF_ssh_simple, true);
    {
        char *key;
        while ((key = conf_get_str_nthstrkey(conf, CONF_portfwd, 0)) != NULL)
            conf_del_str_str(conf, CONF_portfwd, key);
    }

    /* Set up subsystem name. */
    conf_set_str(conf, CONF_remote_cmd, "sftp");
    conf_set_bool(conf, CONF_ssh_subsys, true);
    conf_set_bool(conf, CONF_nopty, true);

    /*
     * Set up fallback option, for SSH-1 servers or servers with the
     * sftp subsystem not enabled but the server binary installed
     * in the usual place. We only support fallback on Unix
     * systems, and we use a kludgy piece of shellery which should
     * try to find sftp-server in various places (the obvious
     * systemwide spots /usr/lib and /usr/local/lib, and then the
     * user's PATH) and finally give up.
     *
     *   test -x /usr/lib/sftp-server && exec /usr/lib/sftp-server
     *   test -x /usr/local/lib/sftp-server && exec /usr/local/lib/sftp-server
     *   exec sftp-server
     *
     * the idea being that this will attempt to use either of the
     * obvious pathnames and then give up, and when it does give up
     * it will print the preferred pathname in the error messages.
     */
    conf_set_str(conf, CONF_remote_cmd2,
                 "test -x /usr/lib/sftp-server &&"
                 " exec /usr/lib/sftp-server\n"
                 "test -x /usr/local/lib/sftp-server &&"
                 " exec /usr/local/lib/sftp-server\n"
                 "exec sftp-server");
    conf_set_bool(conf, CONF_ssh_subsys2, false);

    psftp_logctx = log_init(console_cli_logpolicy, conf);

    platform_psftp_pre_conn_setup(console_cli_logpolicy);

    err = backend_init(backend_vt_from_proto(
                           conf_get_int(conf, CONF_protocol)),
                       psftp_seat, &backend, psftp_logctx, conf,
                       conf_get_str(conf, CONF_host),
                       conf_get_int(conf, CONF_port),
                       &realhost, 0,
                       conf_get_bool(conf, CONF_tcp_keepalives));
    if (err != NULL) {
        fprintf(stderr, "ssh_init: %s\n", err);
        return 1;
    }
    while (!backend_sendok(backend)) {
        if (backend_exitcode(backend) >= 0)
            return 1;
        if (ssh_sftp_loop_iteration() < 0) {
            fprintf(stderr, "ssh_init: error during SSH connection setup\n");
            return 1;
        }
    }
    if (verbose && realhost != NULL)
        printf("Connected to %s\n", realhost);
    if (realhost != NULL)
        sfree(realhost);
    return 0;
}